

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O2

void ecatthread(void *ptr)

{
  long lVar1;
  int iVar2;
  in_EBOX_streamt *piVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  timeval tp;
  timespec ts;
  timeval local_50;
  timespec local_40;
  
  pthread_mutex_lock((pthread_mutex_t *)&mutex);
  gettimeofday(&local_50,(__timezone_ptr_t)0x0);
  local_40.tv_sec = local_50.tv_sec;
  local_40.tv_nsec = (local_50.tv_usec / 1000) * 0xf424000000000 + 0xf424000000000 >> 0x20;
  iVar2 = *ptr;
  toff = 0;
  dorun = 0;
  uVar4 = 0;
  do {
    do {
      add_timespec(&local_40,toff + (long)iVar2 * 1000);
      pthread_cond_timedwait
                ((pthread_cond_t *)&cond,(pthread_mutex_t *)&mutex,(timespec *)&local_40);
    } while (dorun < 1);
    gettimeofday(&local_50,(__timezone_ptr_t)0x0);
    ec_send_processdata();
    ec_receive_processdata(2000);
    piVar3 = in_EBOX;
    cyclecount = cyclecount + 1;
    if (streampos < 199999 && uVar4 != in_EBOX->counter) {
      uVar7 = uVar4 + 1;
      uVar4 = (uint)in_EBOX->counter;
      if (uVar7 < uVar4) {
        lVar5 = (long)streampos * 2;
        for (iVar6 = 0; iVar6 != -0x32; iVar6 = iVar6 + -1) {
          *(undefined2 *)((long)stream1 + lVar5) = 20000;
          *(undefined2 *)((long)stream2 + lVar5) = 0xb1e0;
          lVar5 = lVar5 + 2;
        }
      }
      else {
        for (lVar5 = 0; lVar5 != 100; lVar5 = lVar5 + 2) {
          lVar1 = (long)streampos * 2 + lVar5;
          *(int16 *)((long)stream1 + lVar1) = piVar3->stream[lVar5];
          *(int16 *)((long)stream2 + lVar1) = piVar3->stream[lVar5 + 1];
        }
      }
      streampos = streampos + 0x32;
    }
    ec_sync(_ec_DCtime,(long)iVar2 * 1000,&toff);
  } while( true );
}

Assistant:

void ecatthread( void *ptr )
{
   struct timespec   ts;
   struct timeval    tp;
   int rc;
   int ht;
   int i;
   int pcounter = 0;
   int64 cycletime;
   
   rc = pthread_mutex_lock(&mutex);
   rc =  gettimeofday(&tp, NULL);

    /* Convert from timeval to timespec */
   ts.tv_sec  = tp.tv_sec;
   ht = (tp.tv_usec / 1000) + 1; /* round to nearest ms */
   ts.tv_nsec = ht * 1000000;
   cycletime = *(int*)ptr * 1000; /* cycletime in ns */
   toff = 0;
   dorun = 0;
   while(1)
   {   
      /* calculate next cycle start */
      add_timespec(&ts, cycletime + toff);
      /* wait to cycle start */
      rc = pthread_cond_timedwait(&cond, &mutex, &ts);
      if (dorun>0)
      {
         rc =  gettimeofday(&tp, NULL);

         ec_send_processdata();

         ec_receive_processdata(EC_TIMEOUTRET);

         cyclecount++;

         
         if((in_EBOX->counter != pcounter) && (streampos < (MAXSTREAM - 1)))
         {
            // check if we have timing problems in master
            // if so, overwrite stream data so it shows up clearly in plots.
            if(in_EBOX->counter > (pcounter + 1))
            {
               for(i = 0 ; i < 50 ; i++)
               {
                  stream1[streampos]   = 20000;
                  stream2[streampos++] = -20000;
               }
            }
            else
            {
               for(i = 0 ; i < 50 ; i++)
               {
                  stream1[streampos]   = in_EBOX->stream[i * 2];
                  stream2[streampos++] = in_EBOX->stream[(i * 2) + 1];
               }
            }
            pcounter = in_EBOX->counter;
         }
                      
         /* calulate toff to get linux time and DC synced */
         ec_sync(ec_DCtime, cycletime, &toff);
      }   
   }    
}